

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O3

ssh_compressor * zlib_compress_init(void)

{
  undefined8 *puVar1;
  void *__s;
  undefined8 *puVar2;
  
  puVar1 = (undefined8 *)safemalloc(1,0x28,0);
  __s = safemalloc(1,0x38ffc,0);
  if (__s != (void *)0x0) {
    *puVar1 = __s;
    memset(__s,0xff,0x30000);
    memset((void *)((long)__s + 0x38004),0xff,0xfee);
    *(undefined4 *)((long)__s + 0x38000) = 0;
    *(undefined4 *)((long)__s + 0x38ff8) = 0;
  }
  puVar1[4] = &ssh_zlib;
  puVar1[2] = zlib_literal;
  puVar1[3] = zlib_match;
  puVar2 = (undefined8 *)safemalloc(1,0x18,0);
  *puVar2 = 0;
  puVar2[1] = 0;
  *(undefined4 *)(puVar2 + 2) = 0;
  *(undefined1 *)((long)puVar2 + 0x14) = 1;
  puVar1[1] = puVar2;
  return (ssh_compressor *)(puVar1 + 4);
}

Assistant:

ssh_compressor *zlib_compress_init(void)
{
    struct Outbuf *out;
    struct ssh_zlib_compressor *comp = snew(struct ssh_zlib_compressor);

    lz77_init(&comp->ectx);
    comp->sc.vt = &ssh_zlib;
    comp->ectx.literal = zlib_literal;
    comp->ectx.match = zlib_match;

    out = snew(struct Outbuf);
    out->outbuf = NULL;
    out->outbits = out->noutbits = 0;
    out->firstblock = true;
    comp->ectx.userdata = out;

    return &comp->sc;
}